

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void processIncludeDirectories
               (cmGeneratorTarget *tgt,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *entries,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *includes,
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *uniqueIncludes,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugIncludes,string *language)

{
  char cVar1;
  cmLinkItem *this;
  cmTarget *pcVar2;
  cmLocalGenerator *pcVar3;
  pointer pcVar4;
  bool bVar5;
  PolicyStatus PVar6;
  string *arg;
  ostream *poVar7;
  long *plVar8;
  cmake *this_00;
  cmGeneratorExpressionDAGChecker *pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  _func_int **pp_Var11;
  PolicyID id;
  PolicyID id_00;
  pointer filename;
  __hashtable *__h;
  MessageType MVar12;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar13;
  undefined7 in_stack_00000009;
  undefined8 in_stack_00000018;
  string usedIncludes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryIncludes;
  string inc;
  undefined1 local_2a0 [32];
  cmGeneratorTarget *local_280;
  undefined4 local_274;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Rb_tree_node_base *local_250;
  long local_248;
  _Rb_tree_node_base local_240;
  PolicyMap *local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  long *local_200 [2];
  long local_1f0 [2];
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1e0;
  string *local_1d8;
  pointer *local_1d0;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_1c8;
  string *local_1c0;
  cmListFileBacktrace local_1b8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  if ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)entries != includes) {
    local_220 = &tgt->PolicyMap;
    local_280 = tgt;
    local_1e0 = includes;
    local_1d8 = config;
    local_1c8 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                uniqueIncludes;
    do {
      local_240._M_left = *(_Base_ptr *)entries;
      this = (cmLinkItem *)(((pointer)local_240._M_left)->Value)._M_string_length;
      local_1d0 = (pointer *)entries;
      local_240._M_right = (_Base_ptr)cmLinkItem::AsStr_abi_cxx11_(this);
      if (this->Target == (cmGeneratorTarget *)0x0) {
        local_274 = 0;
      }
      else {
        pcVar2 = this->Target->Target;
        local_274 = (undefined4)CONCAT71((int7)((ulong)pcVar2 >> 8),pcVar2->IsImportedTarget);
      }
      cVar1 = *(char *)&this[1].String._M_dataplus._M_p;
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      arg = (string *)
            (**(code **)((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &(local_240._M_left)->_M_color)->_M_dataplus)._M_p + 0x18))
                      (local_240._M_left,local_280->LocalGenerator,
                       CONCAT71(in_stack_00000009,debugIncludes),0,local_280,local_1d8,
                       in_stack_00000018);
      cmSystemTools::ExpandListArgument(arg,&local_218,false);
      local_250 = &local_240;
      local_248 = 0;
      local_240._M_color._0_1_ = _S_red;
      local_1c0 = local_218.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      filename = local_218.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (local_218.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_218.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          if (((char)local_274 != '\0') &&
             (bVar5 = cmsys::SystemTools::FileExists(filename), !bVar5)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            MVar12 = FATAL_ERROR;
            if (cVar1 != '\0') {
              PVar6 = cmPolicies::PolicyMap::Get(local_220,CMP0027);
              if (PVar6 != OLD) {
                if (PVar6 != WARN) goto LAB_002c0d25;
                cmPolicies::GetPolicyWarning_abi_cxx11_
                          ((string *)local_2a0,(cmPolicies *)0x1b,id_00);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,(char *)local_2a0._0_8_,local_2a0._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                if ((cmGeneratorExpressionDAGChecker *)local_2a0._0_8_ !=
                    (cmGeneratorExpressionDAGChecker *)(local_2a0 + 0x10)) {
                  operator_delete((void *)local_2a0._0_8_,(ulong)(local_2a0._16_8_ + 1));
                }
              }
              MVar12 = AUTHOR_WARNING;
            }
LAB_002c0d25:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Imported target \"",0x11);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,
                                ((_Alloc_hider *)&(local_240._M_right)->_M_color)->_M_p,
                                (long)(local_240._M_right)->_M_parent);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"\" includes non-existent path\n  \"",0x20);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(filename->_M_dataplus)._M_p,filename->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,
                       "\"\nin its INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n* The path was deleted, renamed, or moved to another location.\n* An install or uninstall procedure did not complete successfully.\n* The installation package was faulty and references files it does not provide.\n"
                       ,0x114);
            pcVar3 = local_280->LocalGenerator;
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(pcVar3,MVar12,(string *)local_2a0);
            if ((cmGeneratorExpressionDAGChecker *)local_2a0._0_8_ !=
                (cmGeneratorExpressionDAGChecker *)(local_2a0 + 0x10)) {
              operator_delete((void *)local_2a0._0_8_,(ulong)(local_2a0._16_8_ + 1));
            }
            goto LAB_002c0dda;
          }
          bVar5 = cmsys::SystemTools::FileIsFullPath(filename);
          if (!bVar5) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            if ((local_240._M_right)->_M_parent == (_Base_ptr)0x0) {
              PVar6 = cmPolicies::PolicyMap::Get(local_220,CMP0021);
              MVar12 = FATAL_ERROR;
              if (PVar6 == OLD) {
                bVar5 = true;
              }
              else {
                if (PVar6 == WARN) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_2a0,(cmPolicies *)0x15,id)
                  ;
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a8,(char *)local_2a0._0_8_,local_2a0._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  if ((cmGeneratorExpressionDAGChecker *)local_2a0._0_8_ !=
                      (cmGeneratorExpressionDAGChecker *)(local_2a0 + 0x10)) {
                    operator_delete((void *)local_2a0._0_8_,(ulong)(local_2a0._16_8_ + 1));
                  }
                  MVar12 = AUTHOR_WARNING;
                }
                bVar5 = false;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "Found relative path while evaluating include directories of \"",0x3d);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(local_280->Target->Name)._M_dataplus._M_p,
                                  (local_280->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\":\n  \"",6);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(filename->_M_dataplus)._M_p,filename->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
              if (!bVar5) goto LAB_002c0828;
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8)
              ;
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,
                                  ((_Alloc_hider *)&(local_240._M_right)->_M_color)->_M_p,
                                  (long)(local_240._M_right)->_M_parent);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,
                         "\" contains relative path in its INTERFACE_INCLUDE_DIRECTORIES:\n  \"",
                         0x42);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(filename->_M_dataplus)._M_p,filename->_M_string_length);
              MVar12 = FATAL_ERROR;
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
LAB_002c0828:
              pcVar3 = local_280->LocalGenerator;
              std::__cxx11::stringbuf::str();
              cmLocalGenerator::IssueMessage(pcVar3,MVar12,(string *)local_2a0);
              if ((cmGeneratorExpressionDAGChecker *)local_2a0._0_8_ !=
                  (cmGeneratorExpressionDAGChecker *)(local_2a0 + 0x10)) {
                operator_delete((void *)local_2a0._0_8_,(ulong)(local_2a0._16_8_ + 1));
              }
              if (MVar12 == FATAL_ERROR) {
LAB_002c0dda:
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
                if (local_250 != &local_240) {
                  operator_delete(local_250,
                                  CONCAT71(local_240._1_7_,(undefined1)local_240._M_color) + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_218);
                return;
              }
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          bVar5 = cmSystemTools::IsOff(filename);
          if (!bVar5) {
            cmsys::SystemTools::ConvertToUnixSlashes(filename);
          }
          local_1a8._0_8_ = local_1a8 + 0x10;
          pcVar4 = (filename->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar4,pcVar4 + filename->_M_string_length);
          local_2a0._0_8_ = dagChecker;
          pVar13 = std::
                   _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   ::
                   _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                             ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                               *)dagChecker,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1a8,(cmListFileBacktrace *)local_2a0);
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            (**(code **)((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &(local_240._M_left)->_M_color)->_M_dataplus)._M_p + 0x20))
                      ((cmListFileBacktrace *)local_2a0);
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string&,cmListFileBacktrace>
                      (local_1c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,(cmListFileBacktrace *)local_2a0);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
            }
            if ((char)language != '\0') {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_270," * ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1a8);
              plVar8 = (long *)std::__cxx11::string::append(local_270._M_local_buf);
              local_2a0._0_8_ = local_2a0 + 0x10;
              pcVar9 = (cmGeneratorExpressionDAGChecker *)(plVar8 + 2);
              if ((cmGeneratorExpressionDAGChecker *)*plVar8 == pcVar9) {
                local_2a0._16_8_ = pcVar9->Parent;
                local_2a0._24_8_ = plVar8[3];
              }
              else {
                local_2a0._16_8_ = pcVar9->Parent;
                local_2a0._0_8_ = (cmGeneratorExpressionDAGChecker *)*plVar8;
              }
              local_2a0._8_8_ = plVar8[1];
              *plVar8 = (long)pcVar9;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_250,local_2a0._0_8_);
              if ((cmGeneratorExpressionDAGChecker *)local_2a0._0_8_ !=
                  (cmGeneratorExpressionDAGChecker *)(local_2a0 + 0x10)) {
                operator_delete((void *)local_2a0._0_8_,(ulong)(local_2a0._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270._M_allocated_capacity != &local_260) {
                operator_delete((void *)local_270._M_allocated_capacity,
                                local_260._M_allocated_capacity + 1);
              }
            }
          }
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1))
            ;
          }
          filename = filename + 1;
        } while (filename != local_1c0);
        if (local_248 != 0) {
          this_00 = cmLocalGenerator::GetCMakeInstance(local_280->LocalGenerator);
          local_200[0] = local_1f0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_200,"Used includes for target ","");
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_200,
                                      (ulong)(local_280->Target->Name)._M_dataplus._M_p);
          local_270._M_allocated_capacity = (size_type)&local_260;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 == paVar10) {
            local_260._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_260._8_8_ = plVar8[3];
          }
          else {
            local_260._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_270._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar8;
          }
          local_270._8_8_ = plVar8[1];
          *plVar8 = (long)paVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append(local_270._M_local_buf);
          local_2a0._0_8_ = local_2a0 + 0x10;
          pcVar9 = (cmGeneratorExpressionDAGChecker *)(plVar8 + 2);
          if ((cmGeneratorExpressionDAGChecker *)*plVar8 == pcVar9) {
            local_2a0._16_8_ = pcVar9->Parent;
            local_2a0._24_8_ = plVar8[3];
          }
          else {
            local_2a0._16_8_ = pcVar9->Parent;
            local_2a0._0_8_ = (cmGeneratorExpressionDAGChecker *)*plVar8;
          }
          local_2a0._8_8_ = plVar8[1];
          *plVar8 = (long)pcVar9;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::_M_append((char *)local_2a0,(ulong)local_250);
          local_1a8._0_8_ = local_1a8 + 0x10;
          pp_Var11 = (_func_int **)(plVar8 + 2);
          if ((_func_int **)*plVar8 == pp_Var11) {
            local_198[0]._0_8_ = *pp_Var11;
            local_198[0]._8_4_ = *(undefined4 *)(plVar8 + 3);
            local_198[0]._12_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
          }
          else {
            local_198[0]._0_8_ = *pp_Var11;
            local_1a8._0_8_ = (_func_int **)*plVar8;
          }
          local_1a8._8_8_ = plVar8[1];
          *plVar8 = (long)pp_Var11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          (**(code **)((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &(local_240._M_left)->_M_color)->_M_dataplus)._M_p + 0x20))(&local_1b8);
          cmake::IssueMessage(this_00,LOG,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1a8,&local_1b8);
          if (local_1b8.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1b8.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1))
            ;
          }
          if ((cmGeneratorExpressionDAGChecker *)local_2a0._0_8_ !=
              (cmGeneratorExpressionDAGChecker *)(local_2a0 + 0x10)) {
            operator_delete((void *)local_2a0._0_8_,(ulong)(local_2a0._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_allocated_capacity != &local_260) {
            operator_delete((void *)local_270._M_allocated_capacity,
                            local_260._M_allocated_capacity + 1);
          }
          if (local_200[0] != local_1f0) {
            operator_delete(local_200[0],local_1f0[0] + 1);
          }
        }
      }
      if (local_250 != &local_240) {
        operator_delete(local_250,CONCAT71(local_240._1_7_,(undefined1)local_240._M_color) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_218);
      entries = (vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                 *)(local_1d0 + 1);
    } while ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)entries != local_1e0);
  }
  return;
}

Assistant:

static void processIncludeDirectories(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<BT<std::string>>& includes,
  std::unordered_set<std::string>& uniqueIncludes,
  cmGeneratorExpressionDAGChecker* dagChecker, const std::string& config,
  bool debugIncludes, const std::string& language)
{
  for (cmGeneratorTarget::TargetPropertyEntry* entry : entries) {
    cmLinkImplItem const& item = entry->LinkImplItem;
    std::string const& targetName = item.AsStr();
    bool const fromImported = item.Target && item.Target->IsImported();
    bool const checkCMP0027 = item.FromGenex;
    std::vector<std::string> entryIncludes;
    cmSystemTools::ExpandListArgument(entry->Evaluate(tgt->GetLocalGenerator(),
                                                      config, false, tgt,
                                                      dagChecker, language),
                                      entryIncludes);

    std::string usedIncludes;
    for (std::string& entryInclude : entryIncludes) {
      if (fromImported && !cmSystemTools::FileExists(entryInclude)) {
        std::ostringstream e;
        MessageType messageType = MessageType::FATAL_ERROR;
        if (checkCMP0027) {
          switch (tgt->GetPolicyStatusCMP0027()) {
            case cmPolicies::WARN:
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0027) << "\n";
              CM_FALLTHROUGH;
            case cmPolicies::OLD:
              messageType = MessageType::AUTHOR_WARNING;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
          }
        }
        /* clang-format off */
        e << "Imported target \"" << targetName << "\" includes "
             "non-existent path\n  \"" << entryInclude << "\"\nin its "
             "INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n"
             "* The path was deleted, renamed, or moved to another "
             "location.\n"
             "* An install or uninstall procedure did not complete "
             "successfully.\n"
             "* The installation package was faulty and references files it "
             "does not provide.\n";
        /* clang-format on */
        tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
        return;
      }

      if (!cmSystemTools::FileIsFullPath(entryInclude)) {
        std::ostringstream e;
        bool noMessage = false;
        MessageType messageType = MessageType::FATAL_ERROR;
        if (!targetName.empty()) {
          /* clang-format off */
          e << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_INCLUDE_DIRECTORIES:\n"
            "  \"" << entryInclude << "\"";
          /* clang-format on */
        } else {
          switch (tgt->GetPolicyStatusCMP0021()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0021) << "\n";
              messageType = MessageType::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }
          e << "Found relative path while evaluating include directories of "
               "\""
            << tgt->GetName() << "\":\n  \"" << entryInclude << "\"\n";
        }
        if (!noMessage) {
          tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
          if (messageType == MessageType::FATAL_ERROR) {
            return;
          }
        }
      }

      if (!cmSystemTools::IsOff(entryInclude)) {
        cmSystemTools::ConvertToUnixSlashes(entryInclude);
      }
      std::string inc = entryInclude;

      if (uniqueIncludes.insert(inc).second) {
        includes.emplace_back(inc, entry->GetBacktrace());
        if (debugIncludes) {
          usedIncludes += " * " + inc + "\n";
        }
      }
    }
    if (!usedIncludes.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used includes for target ") + tgt->GetName() + ":\n" +
          usedIncludes,
        entry->GetBacktrace());
    }
  }
}